

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDTernary(TranslateToFuzzReader *this)

{
  Expression *a;
  Expression *b;
  Expression *c;
  SIMDTernary *pSVar1;
  
  a = make(this,(Type)0x6);
  b = make(this,(Type)0x6);
  c = make(this,(Type)0x6);
  pSVar1 = Builder::makeSIMDTernary(&this->builder,Bitselect,a,b,c);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDTernary() {
  // TODO: Enable qfma/qfms once it is implemented in V8 and the interpreter
  // SIMDTernaryOp op = pick(Bitselect,
  //                         QFMAF32x4,
  //                         QFMSF32x4,
  //                         QFMAF64x2,
  //                         QFMSF64x2);
  SIMDTernaryOp op = Bitselect;
  Expression* a = make(Type::v128);
  Expression* b = make(Type::v128);
  Expression* c = make(Type::v128);
  return builder.makeSIMDTernary(op, a, b, c);
}